

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ostream *poVar2;
  int iVar3;
  shared_ptr<SchemeObject> sVar4;
  long *local_2b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  ParseResult x_1;
  ParseResult local_270;
  ParseResult x;
  
  init_scheme();
  if (argc < 2) {
    x.result = END;
    x.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    x.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    x.error._M_dataplus._M_p = (pointer)&x.error.field_2;
    x.error._M_string_length = 0;
    x.error.field_2._M_local_buf[0] = '\0';
    while( true ) {
      while( true ) {
        std::operator<<((ostream *)&std::cout,">> ");
        read_object(&x_1,(istream *)&std::cin);
        ParseResult::operator=(&x,&x_1);
        ParseResult::~ParseResult(&x_1);
        if (x.result != ERROR) break;
        poVar2 = std::operator<<((ostream *)&std::cerr,"Parse error: ");
        poVar2 = std::operator<<(poVar2,(string *)&x.error);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      if (x.result == END) break;
      ASTNode::evaluate((ExecutionResult *)&local_270,
                        x.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &global_context);
      sVar4 = ExecutionResult::force_value((ExecutionResult *)&local_2b8);
      (**(code **)(*local_2b8 + 0x10))
                (&x_1,local_2b8,
                 sVar4.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&x_1);
      std::operator<<(poVar2,'\n');
      std::__cxx11::string::~string((string *)&x_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b0);
      ExecutionResult::~ExecutionResult((ExecutionResult *)&local_270);
    }
    ParseResult::~ParseResult(&x);
    iVar3 = 0;
  }
  else {
    std::ifstream::ifstream(&x,argv[1],_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::operator<<((ostream *)&std::cerr,"Error: no such file\n");
      iVar3 = 1;
    }
    else {
      x_1.result = END;
      x_1.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      x_1.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      x_1.error._M_dataplus._M_p = (pointer)&x_1.error.field_2;
      x_1.error._M_string_length = 0;
      x_1.error.field_2._M_local_buf[0] = '\0';
      while( true ) {
        read_object(&local_270,(istream *)&x);
        ParseResult::operator=(&x_1,&local_270);
        ParseResult::~ParseResult(&local_270);
        if (x_1.result == ERROR) break;
        if (x_1.result == END) {
          iVar3 = 0;
          goto LAB_00112134;
        }
        ASTNode::evaluate((ExecutionResult *)&local_270,
                          x_1.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          &global_context);
        ExecutionResult::force_value((ExecutionResult *)&local_2b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b0);
        ExecutionResult::~ExecutionResult((ExecutionResult *)&local_270);
      }
      poVar2 = std::operator<<((ostream *)&std::cerr,"Parse error: ");
      poVar2 = std::operator<<(poVar2,(string *)&x_1.error);
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar3 = 1;
LAB_00112134:
      ParseResult::~ParseResult(&x_1);
    }
    std::ifstream::~ifstream(&x);
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
    init_scheme();
    if(argc <= 1)
    {
        return run_REPL();
    }
    else
    {
        std::ifstream infile(argv[1]);
        if(!infile.is_open())
        {
            std::cerr << "Error: no such file\n";
            return 1;
        }
        return run_file(infile);
    }
}